

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pznoderep.h
# Opt level: O3

void __thiscall
pzgeom::TPZNodeRep<1,_pztopology::TPZPoint>::TPZNodeRep
          (TPZNodeRep<1,_pztopology::TPZPoint> *this,TPZVec<long> *nodeindexes)

{
  int iVar1;
  long lVar2;
  
  (this->super_TPZPoint).super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZNodeRep_0188dfa8
  ;
  lVar2 = 1;
  if (nodeindexes->fNElements < 1) {
    lVar2 = nodeindexes->fNElements;
  }
  iVar1 = (int)lVar2;
  memcpy(this->fNodeIndexes,nodeindexes->fStore,(long)iVar1 * 8);
  if (0 < iVar1) {
    return;
  }
  memset(this->fNodeIndexes + iVar1,0xff,(ulong)(uint)-iVar1 * 8 + 8);
  return;
}

Assistant:

TPZNodeRep(TPZVec<int64_t> &nodeindexes) : TPZRegisterClassId(&TPZNodeRep::ClassId)
        {
            int nn = nodeindexes.NElements() < N ? nodeindexes.NElements() : N;
#ifdef PZDEBUG
            if(nn<N)
            {
                DebugStop();
            }
#endif
            memcpy(fNodeIndexes,&nodeindexes[0],nn*sizeof(int64_t));
            int i;
            for(i=nn; i<N; i++) fNodeIndexes[i]=-1;
        }